

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O0

void __thiscall Pl_AES_PDF::finish(Pl_AES_PDF *this)

{
  logic_error *this_00;
  element_type *peVar1;
  Pipeline *pPVar2;
  unsigned_long local_20;
  byte local_11;
  Pl_AES_PDF *pPStack_10;
  uchar pad;
  Pl_AES_PDF *this_local;
  
  pPStack_10 = this;
  if ((this->encrypt & 1U) == 0) {
    if (this->offset != 0x10) {
      if (0xf < this->offset) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"buffer overflow in AES encryption pipeline");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      memset(this->inbuf + this->offset,0,0x10 - this->offset);
      this->offset = 0x10;
    }
    flush(this,(bool)((this->disable_padding ^ 0xffU) & 1));
  }
  else {
    if (this->offset == 0x10) {
      flush(this,false);
    }
    if ((this->disable_padding & 1U) == 0) {
      local_20 = 0x10 - this->offset;
      local_11 = QIntC::to_uchar<unsigned_long>(&local_20);
      memset(this->inbuf + this->offset,(uint)local_11,(ulong)local_11);
      this->offset = 0x10;
      flush(this,false);
    }
  }
  peVar1 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->crypto);
  (*peVar1->_vptr_QPDFCryptoImpl[0x10])();
  pPVar2 = Pipeline::next(&this->super_Pipeline);
  (*pPVar2->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_AES_PDF::finish()
{
    if (this->encrypt) {
        if (this->offset == this->buf_size) {
            flush(false);
        }
        if (!this->disable_padding) {
            // Pad as described in section 3.5.1 of version 1.7 of the PDF specification, including
            // providing an entire block of padding if the input was a multiple of 16 bytes.
            unsigned char pad = QIntC::to_uchar(this->buf_size - this->offset);
            memset(this->inbuf + this->offset, pad, pad);
            this->offset = this->buf_size;
            flush(false);
        }
    } else {
        if (this->offset != this->buf_size) {
            // This is never supposed to happen as the output is always supposed to be padded.
            // However, we have encountered files for which the output is not a multiple of the
            // block size.  In this case, pad with zeroes and hope for the best.
            if (this->offset >= this->buf_size) {
                throw std::logic_error("buffer overflow in AES encryption pipeline");
            }
            std::memset(this->inbuf + this->offset, 0, this->buf_size - this->offset);
            this->offset = this->buf_size;
        }
        flush(!this->disable_padding);
    }
    this->crypto->rijndael_finalize();
    next()->finish();
}